

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Received_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Resupply_Received_PDU::~Resupply_Received_PDU(Resupply_Received_PDU *this)

{
  (this->super_Logistics_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Resupply_Received_PDU_00334c28;
  std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::clear
            (&this->m_vSupplies);
  std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::~vector
            (&this->m_vSupplies);
  Logistics_Header::~Logistics_Header(&this->super_Logistics_Header);
  return;
}

Assistant:

Resupply_Received_PDU::~Resupply_Received_PDU()
{
    m_vSupplies.clear();
}